

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O0

void loadFunction(LoadState *S,Proto *f,TString *psource)

{
  lu_byte lVar1;
  int iVar2;
  TString *pTVar3;
  TString *psource_local;
  Proto *f_local;
  LoadState *S_local;
  
  pTVar3 = loadStringN(S,f);
  f->source = pTVar3;
  if (f->source == (TString *)0x0) {
    f->source = psource;
  }
  iVar2 = loadInt(S);
  f->linedefined = iVar2;
  iVar2 = loadInt(S);
  f->lastlinedefined = iVar2;
  lVar1 = loadByte(S);
  f->numparams = lVar1;
  lVar1 = loadByte(S);
  f->is_vararg = lVar1;
  lVar1 = loadByte(S);
  f->maxstacksize = lVar1;
  loadCode(S,f);
  loadConstants(S,f);
  loadUpvalues(S,f);
  loadProtos(S,f);
  loadDebug(S,f);
  return;
}

Assistant:

static void loadFunction (LoadState *S, Proto *f, TString *psource) {
  f->source = loadStringN(S, f);
  if (f->source == NULL)  /* no source in dump? */
    f->source = psource;  /* reuse parent's source */
  f->linedefined = loadInt(S);
  f->lastlinedefined = loadInt(S);
  f->numparams = loadByte(S);
  f->is_vararg = loadByte(S);
  f->maxstacksize = loadByte(S);
  loadCode(S, f);
  loadConstants(S, f);
  loadUpvalues(S, f);
  loadProtos(S, f);
  loadDebug(S, f);
}